

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlValidatePopElement(void)

{
  int iVar1;
  int iVar2;
  xmlValidCtxtPtr val;
  xmlDocPtr val_00;
  xmlNodePtr val_01;
  xmlChar *val_02;
  int local_54;
  int n_qname;
  xmlChar *qname;
  int n_elem;
  xmlNodePtr elem;
  int n_doc;
  xmlDocPtr doc;
  int n_ctxt;
  xmlValidCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (doc._4_4_ = 0; (int)doc._4_4_ < 2; doc._4_4_ = doc._4_4_ + 1) {
    for (elem._4_4_ = 0; (int)elem._4_4_ < 4; elem._4_4_ = elem._4_4_ + 1) {
      for (qname._4_4_ = 0; (int)qname._4_4_ < 3; qname._4_4_ = qname._4_4_ + 1) {
        for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_xmlValidCtxtPtr(doc._4_4_,0);
          val_00 = gen_xmlDocPtr(elem._4_4_,1);
          val_01 = gen_xmlNodePtr(qname._4_4_,2);
          val_02 = gen_const_xmlChar_ptr(local_54,3);
          iVar2 = xmlValidatePopElement(val,val_00,val_01,val_02);
          desret_int(iVar2);
          call_tests = call_tests + 1;
          des_xmlValidCtxtPtr(doc._4_4_,val,0);
          des_xmlDocPtr(elem._4_4_,val_00,1);
          des_xmlNodePtr(qname._4_4_,val_01,2);
          des_const_xmlChar_ptr(local_54,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidatePopElement",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)doc._4_4_);
            printf(" %d",(ulong)elem._4_4_);
            printf(" %d",(ulong)qname._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlValidatePopElement(void) {
    int test_ret = 0;

#if defined(LIBXML_VALID_ENABLED) && defined(LIBXML_REGEXP_ENABLED)
    int mem_base;
    int ret_val;
    xmlValidCtxtPtr ctxt; /* the validation context */
    int n_ctxt;
    xmlDocPtr doc; /* a document instance */
    int n_doc;
    xmlNodePtr elem; /* an element instance */
    int n_elem;
    xmlChar * qname; /* the qualified name as appearing in the serialization */
    int n_qname;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlValidCtxtPtr;n_ctxt++) {
    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_elem = 0;n_elem < gen_nb_xmlNodePtr;n_elem++) {
    for (n_qname = 0;n_qname < gen_nb_const_xmlChar_ptr;n_qname++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlValidCtxtPtr(n_ctxt, 0);
        doc = gen_xmlDocPtr(n_doc, 1);
        elem = gen_xmlNodePtr(n_elem, 2);
        qname = gen_const_xmlChar_ptr(n_qname, 3);

        ret_val = xmlValidatePopElement(ctxt, doc, elem, (const xmlChar *)qname);
        desret_int(ret_val);
        call_tests++;
        des_xmlValidCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlDocPtr(n_doc, doc, 1);
        des_xmlNodePtr(n_elem, elem, 2);
        des_const_xmlChar_ptr(n_qname, (const xmlChar *)qname, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlValidatePopElement",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_doc);
            printf(" %d", n_elem);
            printf(" %d", n_qname);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}